

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O2

void cdft(int n,int isgn,double *a,int *ip,double *w)

{
  if (*ip * 4 < n) {
    makewt(n >> 2,ip,w);
  }
  if (n < 5) {
    if (n != 4) {
      return;
    }
    n = 4;
  }
  else {
    if (isgn < 0) {
      bitrv2conj(n,ip + 2,a);
      cftbsub(n,a,w);
      return;
    }
    bitrv2(n,ip + 2,a);
  }
  cftfsub(n,a,w);
  return;
}

Assistant:

void cdft(int n, int isgn, double *a, int *ip, double *w)
{
    void makewt(int nw, int *ip, double *w);
    void bitrv2(int n, int *ip, double *a);
    void bitrv2conj(int n, int *ip, double *a);
    void cftfsub(int n, double *a, double *w);
    void cftbsub(int n, double *a, double *w);
    
    if (n > (ip[0] << 2)) {
        makewt(n >> 2, ip, w);
    }
    if (n > 4) {
        if (isgn >= 0) {
            bitrv2(n, ip + 2, a);
            cftfsub(n, a, w);
        } else {
            bitrv2conj(n, ip + 2, a);
            cftbsub(n, a, w);
        }
    } else if (n == 4) {
        cftfsub(n, a, w);
    }
}